

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

void * hash_table_new_item(hash_table_t *table,void *key)

{
  size_t sVar1;
  int iVar2;
  size_t sVar3;
  hash_table_bucket_t *phVar4;
  hash_table_bucket_t *phVar5;
  ulong uVar6;
  int iVar7;
  char *__ptr;
  hash_table_bucket_t **pphVar8;
  uint uVar9;
  ulong uVar10;
  double dVar11;
  size_t sStack_30;
  
  dVar11 = ((double)table->n_items + 1.0) / (double)table->n_buckets;
  if (table->max_load <= dVar11 && dVar11 != table->max_load) {
    hash_table_increase_buckets(table);
  }
  iVar7 = 0;
  do {
    if (iVar7 == 5) {
      __ptr = "hash_table_new_item: Beaten by the odds; too many rehashes\n";
      sStack_30 = 0x3b;
LAB_001112f4:
      fwrite(__ptr,sStack_30,1,_stderr);
      abort();
    }
    sVar1 = (table->ghash).mult;
    sVar3 = (*table->hash)(key);
    uVar9 = 0;
    phVar5 = table->buckets +
             (sVar3 * sVar1 + (table->ghash).add >> (-(char)(table->ghash).log2_buckets & 0x3fU) &
             0xffffffff);
    while( true ) {
      pphVar8 = &phVar5->next;
      if (*pphVar8 == (hash_table_bucket_t *)0x0) break;
      iVar2 = (*table->is_equal)(key,(*pphVar8)->data);
      if (iVar2 != 0) goto LAB_001112d1;
      uVar9 = uVar9 + 1;
      phVar5 = *pphVar8;
    }
    if (uVar9 <= table->max_collisions) {
      phVar5 = table->free_buckets;
      if (phVar5 != (hash_table_bucket_t *)0x0) goto LAB_001112bb;
      uVar9 = table->n_buckets;
      phVar4 = (hash_table_bucket_t *)calloc((ulong)uVar9,0x10);
      if (phVar4 != (hash_table_bucket_t *)0x0) {
        phVar4->next = table->allocs;
        table->allocs = phVar4;
        uVar10 = (ulong)(uVar9 - 1);
        phVar5 = phVar4 + 2;
        for (uVar6 = 1; uVar6 < uVar10; uVar6 = uVar6 + 1) {
          phVar5[-1].next = phVar5;
          phVar5[-1].data = (void *)0x0;
          phVar5 = phVar5 + 1;
        }
        phVar5 = phVar4 + 1;
        phVar4[uVar10].data = (void *)0x0;
        phVar4[uVar10].next = (hash_table_bucket_t *)0x0;
LAB_001112bb:
        table->free_buckets = phVar5->next;
        phVar5->next = (hash_table_bucket_t *)0x0;
        *pphVar8 = phVar5;
        phVar5->data = key;
        table->n_items = table->n_items + 1;
LAB_001112d1:
        return (*pphVar8)->data;
      }
      __ptr = "hash_table_increase_free_buckets: insufficient memory\n";
      sStack_30 = 0x36;
      goto LAB_001112f4;
    }
    hash_table_increase_buckets(table);
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

void * hash_table_new_item( hash_table_t * table, void * key )
{
    int try;
    double load = (table->n_items + 1.0)/table->n_buckets;
    hash_table_bucket_t ** b;
    hash_table_bucket_t * new_bucket;

    if (load > table->max_load)
        hash_table_increase_buckets( table );

    for ( try = 0; try < 5; ++try ) {
        unsigned collisions = 0;
        unsigned i = (unsigned) hash( table->ghash, (* table->hash )( key ) );
        b = & table->buckets[i].next;
        
        while (*b) {
            if ( (*table->is_equal)(key, (*b)->data) )
                return (*b)->data;
            collisions += 1;
            b = &(*b)->next;
        }

        if ( collisions > table->max_collisions ) 
            hash_table_increase_buckets( table );
        else
            goto found_item;
    }

    fprintf(stderr, "hash_table_new_item: Beaten by the odds; "
            "too many rehashes\n");
    abort();

found_item:

    if ( table->free_buckets == NULL )
        hash_table_increase_free_buckets( table );

    /* pop a free bucket from the free list */
    new_bucket = table->free_buckets;
    table->free_buckets = table->free_buckets->next;
    new_bucket->next = NULL;
    new_bucket->data = NULL;

    /* append it to the end of the bucket list */
    *b = new_bucket;
    (*b)->data = key;
    table->n_items += 1;
    return (*b)->data;
}